

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

format_arg * __thiscall
fmt::v5::internal::
context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
::do_get_arg(format_arg *__return_storage_ptr__,
            context_base<fmt::v5::internal::counting_iterator<char>,_fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>,_char>
            *this,uint arg_id)

{
  basic_format_args<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  ::get(__return_storage_ptr__,&this->args_,arg_id);
  if (__return_storage_ptr__->type_ == none_type) {
    error_handler::on_error((error_handler *)this,"argument index out of range");
  }
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get_arg(unsigned arg_id) {
    format_arg arg = args_.get(arg_id);
    if (!arg)
      parse_context_.on_error("argument index out of range");
    return arg;
  }